

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O0

void brngHMACStart(void *state,octet *key,size_t key_len,octet *iv,size_t iv_len)

{
  undefined8 in_RCX;
  undefined8 *in_RDI;
  ulong in_R8;
  brng_hmac_st *s;
  void *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  octet *mac;
  undefined8 *count;
  size_t in_stack_ffffffffffffffc0;
  undefined8 *buf;
  octet *in_stack_ffffffffffffffc8;
  
  in_RDI[9] = in_R8;
  if (in_R8 < 0x41) {
    memCopy(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x14fe83);
    *in_RDI = in_RDI + 1;
  }
  else {
    *in_RDI = in_RCX;
  }
  mac = (octet *)(in_RDI + 0x13);
  beltHMAC_keep();
  beltHMACStart(in_RDI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  buf = in_RDI + 0x13;
  count = in_RDI + 0x13;
  beltHMAC_keep();
  beltHMAC_keep();
  memCopy(mac,in_stack_ffffffffffffffa8,0x14ff21);
  beltHMACStepA(buf,(size_t)count,mac);
  beltHMACStepG(mac,in_stack_ffffffffffffffa8);
  in_RDI[0x12] = 0;
  return;
}

Assistant:

void brngHMACStart(void* state, const octet key[], size_t key_len, 
	const octet iv[], size_t iv_len)
{
	brng_hmac_st* s = (brng_hmac_st*)state;
	ASSERT(memIsDisjoint2(s, brngHMAC_keep(), key, key_len));
	ASSERT(memIsDisjoint2(s, brngHMAC_keep(), iv, iv_len));
	// запомнить iv
	if ((s->iv_len = iv_len) <= 64) 
	{
		memCopy(s->iv_buf, iv, iv_len);
		s->iv = s->iv_buf;
	}
	else
		s->iv = iv;
	// обработать key
	beltHMACStart(s->state_ex + beltHMAC_keep(), key, key_len);
	// r <- beltHMAC(key, iv)
	memCopy(s->state_ex, s->state_ex + beltHMAC_keep(), beltHMAC_keep());
	beltHMACStepA(iv, iv_len, s->state_ex);
	beltHMACStepG(s->r, s->state_ex);
	// нет выходных данных
	s->reserved = 0;
}